

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCTas.c
# Opt level: O0

int Tas_StorePattern(Vec_Ptr_t *vSimInfo,Vec_Ptr_t *vPres,Vec_Int_t *vCex)

{
  int iVar1;
  int *pLits;
  int local_24;
  int k;
  Vec_Int_t *vCex_local;
  Vec_Ptr_t *vPres_local;
  Vec_Ptr_t *vSimInfo_local;
  
  for (local_24 = 1; local_24 < 0x20; local_24 = local_24 + 1) {
    pLits = Vec_IntArray(vCex);
    iVar1 = Vec_IntSize(vCex);
    iVar1 = Tas_StorePatternTry(vSimInfo,vPres,local_24,pLits,iVar1);
    if (iVar1 != 0) break;
  }
  return (int)(local_24 < 0x20);
}

Assistant:

int Tas_StorePattern( Vec_Ptr_t * vSimInfo, Vec_Ptr_t * vPres, Vec_Int_t * vCex )
{
    int k;
    for ( k = 1; k < 32; k++ )
        if ( Tas_StorePatternTry( vSimInfo, vPres, k, (int *)Vec_IntArray(vCex), Vec_IntSize(vCex) ) )
            break;
    return (int)(k < 32);
}